

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetAppendTxOutFundRawTx(void *handle,void *fund_handle,uint32_t index,char **append_address)

{
  pointer pcVar1;
  long *plVar2;
  char *pcVar3;
  CfdException *pCVar4;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FundRawTxData","");
  cfd::capi::CheckBuffer(fund_handle,(string *)local_50);
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (append_address != (char **)0x0) {
    plVar2 = *(long **)((long)fund_handle + 0x50);
    if (plVar2 != (long *)0x0) {
      if ((ulong)index < (ulong)(plVar2[1] - *plVar2 >> 5)) {
        pcVar3 = cfd::capi::CreateString((string *)(*plVar2 + (ulong)index * 0x20));
        *append_address = pcVar3;
        return 0;
      }
    }
    local_50._0_8_ = "cfdcapi_transaction.cpp";
    local_50._8_4_ = 0xd15;
    local_50._16_8_ = "CfdGetAppendTxOutFundRawTx";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"target addresses is maximum over."
              );
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. target addresses is maximum over.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_50);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_50._0_8_ = "cfdcapi_transaction.cpp";
  local_50._8_4_ = 0xd0b;
  local_50._16_8_ = "CfdGetAppendTxOutFundRawTx";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"append_address is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to parameter. append_address is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetAppendTxOutFundRawTx(
    void* handle, void* fund_handle, uint32_t index, char** append_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (append_address == nullptr) {
      warn(CFD_LOG_SOURCE, "append_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. append_address is null.");
    }

    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);
    if ((buffer->append_txout_addresses == nullptr) ||
        (index >= buffer->append_txout_addresses->size())) {
      warn(CFD_LOG_SOURCE, "target addresses is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. target addresses is maximum over.");
    }

    *append_address = CreateString(buffer->append_txout_addresses->at(index));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}